

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

SharedPluralRules *
icu_63::PluralRules::createSharedInstance(Locale *locale,UPluralType type,UErrorCode *status)

{
  UBool UVar1;
  Locale *local_30;
  SharedPluralRules *result;
  UErrorCode *status_local;
  Locale *pLStack_18;
  UPluralType type_local;
  Locale *locale_local;
  
  result = (SharedPluralRules *)status;
  status_local._4_4_ = type;
  pLStack_18 = locale;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (status_local._4_4_ == UPLURAL_TYPE_CARDINAL) {
      local_30 = (Locale *)0x0;
      UnifiedCache::getByLocale<icu_63::SharedPluralRules>
                (pLStack_18,(SharedPluralRules **)&local_30,(UErrorCode *)result);
      locale_local = local_30;
    }
    else {
      *(undefined4 *)&(result->super_SharedObject).super_UObject._vptr_UObject = 0x10;
      locale_local = (Locale *)0x0;
    }
  }
  else {
    locale_local = (Locale *)0x0;
  }
  return (SharedPluralRules *)locale_local;
}

Assistant:

const SharedPluralRules* U_EXPORT2
PluralRules::createSharedInstance(
        const Locale& locale, UPluralType type, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return nullptr;
    }
    if (type != UPLURAL_TYPE_CARDINAL) {
        status = U_UNSUPPORTED_ERROR;
        return nullptr;
    }
    const SharedPluralRules *result = nullptr;
    UnifiedCache::getByLocale(locale, result, status);
    return result;
}